

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCare.c
# Opt level: O1

Abc_Cex_t *
Bmc_CexCarePropagateBwd(Gia_Man_t *p,Abc_Cex_t *pCex,Vec_Int_t *vPriosIn,Vec_Int_t *vPriosFf)

{
  Gia_Obj_t *pGVar1;
  bool bVar2;
  int iVar3;
  Abc_Cex_t *pCexMin;
  long lVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  int iVar7;
  uint uVar8;
  Abc_Cex_t *pCex_00;
  int iVar9;
  int iVar10;
  ulong uVar11;
  
  pCexMin = Abc_CexAlloc(pCex->nRegs,pCex->nPis,pCex->iFrame + 1);
  pCexMin->iPo = pCex->iPo;
  pCexMin->iFrame = pCex->iFrame;
  pVVar6 = p->vCos;
  if (0 < pVVar6->nSize) {
    lVar4 = 0;
    do {
      iVar7 = pVVar6->pArray[lVar4];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_00572af1;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = p->pObjs + iVar7;
      *(ulong *)pGVar1 = *(ulong *)pGVar1 & 0x7fffffffffffffff;
      lVar4 = lVar4 + 1;
      pVVar6 = p->vCos;
    } while (lVar4 < pVVar6->nSize);
  }
  if (-1 < pCex->iFrame) {
    iVar7 = pCex->iFrame;
    do {
      uVar8 = pCex->iPo;
      iVar5 = p->vCos->nSize;
      if (iVar5 - p->nRegs <= (int)uVar8) {
        __assert_fail("v < Gia_ManPoNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
      }
      if (((int)uVar8 < 0) || (iVar5 <= (int)uVar8)) {
LAB_00572b10:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar5 = p->vCos->pArray[uVar8];
      lVar4 = (long)iVar5;
      if ((lVar4 < 0) || (p->nObjs <= iVar5)) {
LAB_00572af1:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar11 = 0;
      if (iVar7 == pCex->iFrame) {
        uVar11 = 0x8000000000000000;
      }
      *(ulong *)(p->pObjs + lVar4) = *(ulong *)(p->pObjs + lVar4) & 0x7fffffffffffffff | uVar11;
      iVar5 = p->nRegs;
      if (0 < (long)iVar5) {
        pVVar6 = p->vCis;
        iVar3 = pVVar6->nSize;
        lVar4 = 0;
        do {
          uVar11 = (ulong)(uint)(iVar3 - iVar5) + lVar4;
          iVar9 = (int)uVar11;
          if ((iVar9 < 0) || (iVar3 <= iVar9)) goto LAB_00572b10;
          iVar9 = pVVar6->pArray[uVar11 & 0xffffffff];
          if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) goto LAB_00572af1;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          uVar11 = (ulong)(uint)(pCex->nRegs * iVar7) + lVar4;
          iVar10 = (int)uVar11;
          if ((iVar10 < 0) || (vPriosFf->nSize <= iVar10)) goto LAB_00572b10;
          p->pObjs[iVar9].Value = vPriosFf->pArray[uVar11 & 0xffffffff];
          lVar4 = lVar4 + 1;
        } while (iVar5 != lVar4);
      }
      pCex_00 = pCex;
      Bmc_CexCarePropagateFwdOne(p,pCex,iVar7,vPriosIn);
      Bmc_CexCarePropagateBwdOne(p,pCex_00,iVar7,pCexMin);
      iVar5 = p->nRegs;
      if (0 < iVar5) {
        iVar3 = 0;
        do {
          iVar9 = p->vCos->nSize;
          uVar8 = (iVar9 - iVar5) + iVar3;
          if (((int)uVar8 < 0) || (iVar9 <= (int)uVar8)) goto LAB_00572b10;
          iVar9 = p->vCos->pArray[uVar8];
          if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) goto LAB_00572af1;
          pGVar1 = p->pObjs;
          if (pGVar1 == (Gia_Obj_t *)0x0) break;
          iVar10 = p->vCis->nSize;
          uVar8 = (iVar10 - iVar5) + iVar3;
          if (((int)uVar8 < 0) || (iVar10 <= (int)uVar8)) goto LAB_00572b10;
          iVar5 = p->vCis->pArray[uVar8];
          if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_00572af1;
          *(ulong *)(pGVar1 + iVar9) =
               *(ulong *)(pGVar1 + iVar9) & 0x7fffffffffffffff |
               *(ulong *)(pGVar1 + iVar5) & 0x8000000000000000;
          iVar3 = iVar3 + 1;
          iVar5 = p->nRegs;
        } while (iVar3 < iVar5);
      }
      bVar2 = 0 < iVar7;
      iVar7 = iVar7 + -1;
    } while (bVar2);
  }
  return pCexMin;
}

Assistant:

Abc_Cex_t * Bmc_CexCarePropagateBwd( Gia_Man_t * p, Abc_Cex_t * pCex, Vec_Int_t * vPriosIn, Vec_Int_t * vPriosFf )
{
    Abc_Cex_t * pCexMin;
    Gia_Obj_t * pObjRo, * pObjRi;
    int f, i;
    pCexMin = Abc_CexAlloc( pCex->nRegs, pCex->nPis, pCex->iFrame + 1 );
    pCexMin->iPo    = pCex->iPo;
    pCexMin->iFrame = pCex->iFrame;
    Gia_ManForEachCo( p, pObjRi, i )
        pObjRi->fPhase = 0;
    for ( f = pCex->iFrame; f >= 0; f-- )
    {
        Gia_ManPo(p, pCex->iPo)->fPhase = (int)(f == pCex->iFrame);
        Gia_ManForEachRo( p, pObjRo, i )
            pObjRo->Value = Vec_IntEntry( vPriosFf, f * pCex->nRegs + i );
        Bmc_CexCarePropagateFwdOne( p, pCex, f, vPriosIn );
        Bmc_CexCarePropagateBwdOne( p, pCex, f, pCexMin );
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, i )
            pObjRi->fPhase = pObjRo->fPhase;
    }
    return pCexMin;
}